

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::~IfcGeometricRepresentationContext
          (IfcGeometricRepresentationContext *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  undefined1 *puVar2;
  
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x98d3f8;
  *(undefined8 *)&this->field_0xa8 = 0x98d448;
  *(undefined8 *)&(this->super_IfcRepresentationContext).field_0x60 = 0x98d420;
  this_00 = (this->WorldCoordinateSystem).
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x98d470;
  *(undefined8 *)&this->field_0xa8 = 0x98d498;
  pcVar1 = (this->super_IfcRepresentationContext).ContextType.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_IfcRepresentationContext).ContextType.ptr.field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcRepresentationContext).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x10;
  if (puVar2 != &(this->super_IfcRepresentationContext).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                 field_0x20) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

IfcGeometricRepresentationContext() : Object("IfcGeometricRepresentationContext") {}